

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

char16_t * PAL_wcscat(char16_t *strDestination,char16_t *strSource)

{
  size_t count;
  char16_t *pcVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    count = PAL_wcslen(strSource);
    pcVar1 = PAL_wcsncat(strDestination,strSource,count);
    if (PAL_InitializeChakraCoreCalled != false) {
      return pcVar1;
    }
  }
  abort();
}

Assistant:

char16_t *
__cdecl
PAL_wcscat(
        char16_t *strDestination,
        const char16_t *strSource)
{
    char16_t *ret;
    PERF_ENTRY(wcscat);
    ENTRY("wcscat (strDestination=%p (%S), strSource=%p (%S))\n",
          strDestination?strDestination:W16_NULLSTRING,
          strDestination?strDestination:W16_NULLSTRING, strSource?strSource:W16_NULLSTRING, strSource?strSource:W16_NULLSTRING);

    ret = PAL_wcsncat( strDestination, strSource, PAL_wcslen( strSource ) );

    LOGEXIT("wcscat returning char16_t %p (%S)\n", ret, ret);
    PERF_EXIT(wcscat);
    return ret;
}